

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,REF_DBL *max_error)

{
  REF_MPI pRVar1;
  REF_MPI ref_mpi_00;
  REF_NODE pRVar2;
  REF_NODE pRVar3;
  uint uVar4;
  void *send;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_MPI local_190;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *recept_cell;
  REF_INT *recept_node;
  REF_INT *recept_ret;
  REF_INT *recept_proc;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT *donor_node;
  REF_DBL *donor_bary;
  REF_DBL *recept_bary;
  REF_DBL *donor_xyz;
  REF_DBL *recept_xyz;
  REF_INT n_donor;
  REF_INT donation;
  REF_INT n_recept;
  REF_INT receptor;
  REF_INT j;
  REF_INT i;
  REF_DBL error;
  REF_INT local_c8;
  REF_INT node;
  REF_INT nodes [27];
  REF_NODE from_node;
  REF_CELL from_cell;
  REF_NODE to_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_GRID from_grid;
  REF_DBL *max_error_local;
  REF_INTERP ref_interp_local;
  
  ref_mpi_00 = ref_interp->ref_mpi;
  pRVar2 = ref_interp->to_grid->node;
  pRVar3 = ref_interp->from_grid->node;
  if (ref_interp->from_grid->twod == 0) {
    from_node = (REF_NODE)ref_interp->from_tet;
  }
  else {
    from_node = (REF_NODE)ref_interp->from_tri;
  }
  *max_error = 0.0;
  n_donor = 0;
  for (error._4_4_ = 0; error._4_4_ < pRVar2->max; error._4_4_ = error._4_4_ + 1) {
    if ((((-1 < error._4_4_) && (error._4_4_ < pRVar2->max)) && (-1 < pRVar2->global[error._4_4_]))
       && ((pRVar2->ref_mpi->id == pRVar2->part[error._4_4_] &&
           (ref_interp->cell[error._4_4_] != -1)))) {
      n_donor = n_donor + 1;
    }
  }
  from_grid = (REF_GRID)max_error;
  max_error_local = (REF_DBL *)ref_interp;
  if (n_donor * 4 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x956,
           "ref_interp_max_error","malloc recept_bary of REF_DBL negative");
    ref_interp_local._4_4_ = 1;
  }
  else {
    donor_bary = (REF_DBL *)malloc((long)(n_donor << 2) << 3);
    if (donor_bary == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x956,"ref_interp_max_error","malloc recept_bary of REF_DBL NULL");
      ref_interp_local._4_4_ = 2;
    }
    else if (n_donor < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x957,"ref_interp_max_error","malloc recept_cell of REF_INT negative");
      ref_interp_local._4_4_ = 1;
    }
    else {
      send = malloc((long)n_donor << 2);
      if (send == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x957,"ref_interp_max_error","malloc recept_cell of REF_INT NULL");
        ref_interp_local._4_4_ = 2;
      }
      else if (n_donor < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x958,"ref_interp_max_error","malloc recept_node of REF_INT negative");
        ref_interp_local._4_4_ = 1;
      }
      else {
        recept_cell = (REF_INT *)malloc((long)n_donor << 2);
        if (recept_cell == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x958,"ref_interp_max_error","malloc recept_node of REF_INT NULL");
          ref_interp_local._4_4_ = 2;
        }
        else if (n_donor < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x959,"ref_interp_max_error","malloc recept_ret of REF_INT negative");
          ref_interp_local._4_4_ = 1;
        }
        else {
          recept_node = (REF_INT *)malloc((long)n_donor << 2);
          if (recept_node == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x959,"ref_interp_max_error","malloc recept_ret of REF_INT NULL");
            ref_interp_local._4_4_ = 2;
          }
          else if (n_donor < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x95a,"ref_interp_max_error","malloc recept_proc of REF_INT negative");
            ref_interp_local._4_4_ = 1;
          }
          else {
            recept_ret = (REF_INT *)malloc((long)n_donor << 2);
            if (recept_ret == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x95a,"ref_interp_max_error","malloc recept_proc of REF_INT NULL");
              ref_interp_local._4_4_ = 2;
            }
            else {
              n_donor = 0;
              for (error._4_4_ = 0; error._4_4_ < pRVar2->max; error._4_4_ = error._4_4_ + 1) {
                if (((-1 < error._4_4_) && (error._4_4_ < pRVar2->max)) &&
                   ((-1 < pRVar2->global[error._4_4_] &&
                    ((pRVar2->ref_mpi->id == pRVar2->part[error._4_4_] &&
                     (*(int *)((long)max_error_local[0xc] + (long)error._4_4_ * 4) != -1)))))) {
                  for (receptor = 0; receptor < 4; receptor = receptor + 1) {
                    donor_bary[receptor + n_donor * 4] =
                         *(REF_DBL *)
                          ((long)max_error_local[0xe] + (long)(receptor + error._4_4_ * 4) * 8);
                  }
                  recept_ret[n_donor] =
                       *(REF_INT *)((long)max_error_local[0xd] + (long)error._4_4_ * 4);
                  *(undefined4 *)((long)send + (long)n_donor * 4) =
                       *(undefined4 *)((long)max_error_local[0xc] + (long)error._4_4_ * 4);
                  recept_cell[n_donor] = error._4_4_;
                  recept_node[n_donor] = ref_mpi_00->id;
                  n_donor = n_donor + 1;
                }
              }
              uVar4 = ref_mpi_blindsend(ref_mpi_00,recept_ret,send,1,n_donor,&recept_proc,
                                        (REF_INT *)&recept_xyz,1);
              if (uVar4 == 0) {
                uVar4 = ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_node,1,n_donor,&donor_cell,
                                          (REF_INT *)&recept_xyz,1);
                if (uVar4 == 0) {
                  uVar4 = ref_mpi_blindsend(ref_mpi_00,recept_ret,recept_cell,1,n_donor,&donor_ret,
                                            (REF_INT *)&recept_xyz,1);
                  if (uVar4 == 0) {
                    uVar4 = ref_mpi_blindsend(ref_mpi_00,recept_ret,donor_bary,4,n_donor,&donor_node
                                              ,(REF_INT *)&recept_xyz,3);
                    if (uVar4 == 0) {
                      if (recept_ret != (REF_INT *)0x0) {
                        free(recept_ret);
                      }
                      if (recept_node != (REF_INT *)0x0) {
                        free(recept_node);
                      }
                      if (recept_cell != (REF_INT *)0x0) {
                        free(recept_cell);
                      }
                      if (send != (void *)0x0) {
                        free(send);
                      }
                      if (donor_bary != (REF_DBL *)0x0) {
                        free(donor_bary);
                      }
                      if ((int)recept_xyz * 3 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x97d,"ref_interp_max_error","malloc donor_xyz of REF_DBL negative")
                        ;
                        ref_interp_local._4_4_ = 1;
                      }
                      else {
                        recept_bary = (REF_DBL *)malloc((long)((int)recept_xyz * 3) << 3);
                        if (recept_bary == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x97d,"ref_interp_max_error","malloc donor_xyz of REF_DBL NULL");
                          ref_interp_local._4_4_ = 2;
                        }
                        else {
                          for (recept_xyz._4_4_ = 0; recept_xyz._4_4_ < (int)recept_xyz;
                              recept_xyz._4_4_ = recept_xyz._4_4_ + 1) {
                            uVar4 = ref_cell_nodes((REF_CELL)from_node,recept_proc[recept_xyz._4_4_]
                                                   ,&local_c8);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x981,"ref_interp_max_error",(ulong)uVar4,
                                     "node needs to be localized");
                              return uVar4;
                            }
                            for (receptor = 0; receptor < 3; receptor = receptor + 1) {
                              recept_bary[receptor + recept_xyz._4_4_ * 3] = 0.0;
                              for (n_recept = 0; n_recept < *(int *)&from_node->field_0xc;
                                  n_recept = n_recept + 1) {
                                iVar5 = receptor + recept_xyz._4_4_ * 3;
                                recept_bary[iVar5] =
                                     *(double *)
                                      (donor_node + (long)(n_recept + recept_xyz._4_4_ * 4) * 2) *
                                     pRVar3->real[receptor + (&local_c8)[n_recept] * 0xf] +
                                     recept_bary[iVar5];
                              }
                            }
                          }
                          if (recept_proc != (REF_INT *)0x0) {
                            free(recept_proc);
                          }
                          if (donor_node != (REF_INT *)0x0) {
                            free(donor_node);
                          }
                          uVar4 = ref_mpi_blindsend(ref_mpi_00,donor_cell,recept_bary,3,
                                                    (int)recept_xyz,&donor_xyz,&n_donor,3);
                          if (uVar4 == 0) {
                            uVar4 = ref_mpi_blindsend(ref_mpi_00,donor_cell,donor_ret,1,
                                                      (int)recept_xyz,&recept_cell,&n_donor,1);
                            if (uVar4 == 0) {
                              if (recept_bary != (REF_DBL *)0x0) {
                                free(recept_bary);
                              }
                              if (donor_ret != (REF_INT *)0x0) {
                                free(donor_ret);
                              }
                              if (donor_cell != (REF_INT *)0x0) {
                                free(donor_cell);
                              }
                              for (donation = 0; donation < n_donor; donation = donation + 1) {
                                error._4_4_ = recept_cell[donation];
                                dVar6 = pow(donor_xyz[donation * 3] -
                                            pRVar2->real[error._4_4_ * 0xf],2.0);
                                dVar7 = pow(donor_xyz[donation * 3 + 1] -
                                            pRVar2->real[error._4_4_ * 0xf + 1],2.0);
                                dVar8 = pow(donor_xyz[donation * 3 + 2] -
                                            pRVar2->real[error._4_4_ * 0xf + 2],2.0);
                                _j = (REF_MPI)(dVar6 + dVar7 + dVar8);
                                pRVar1 = from_grid->mpi;
                                dVar6 = sqrt((double)_j);
                                if ((double)pRVar1 <= dVar6) {
                                  local_190 = (REF_MPI)sqrt((double)_j);
                                }
                                else {
                                  local_190 = from_grid->mpi;
                                }
                                from_grid->mpi = local_190;
                              }
                              if (recept_cell != (REF_INT *)0x0) {
                                free(recept_cell);
                              }
                              if (donor_xyz != (REF_DBL *)0x0) {
                                free(donor_xyz);
                              }
                              _j = from_grid->mpi;
                              uVar4 = ref_mpi_max(ref_mpi_00,&j,from_grid,3);
                              if (uVar4 == 0) {
                                ref_interp_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&from_grid,1,3);
                                if (ref_interp_local._4_4_ == 0) {
                                  ref_interp_local._4_4_ = 0;
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x9a4,"ref_interp_max_error",(ulong)ref_interp_local._4_4_
                                         ,"max");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x9a3,"ref_interp_max_error",(ulong)uVar4,"max");
                                ref_interp_local._4_4_ = uVar4;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x992,"ref_interp_max_error",(ulong)uVar4,"blind send node");
                              ref_interp_local._4_4_ = uVar4;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                   ,0x98f,"ref_interp_max_error",(ulong)uVar4,"blind send bary");
                            ref_interp_local._4_4_ = uVar4;
                          }
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x975,"ref_interp_max_error",(ulong)uVar4,"blind send bary");
                      ref_interp_local._4_4_ = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x972,"ref_interp_max_error",(ulong)uVar4,"blind send node");
                    ref_interp_local._4_4_ = uVar4;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x96f,"ref_interp_max_error",(ulong)uVar4,"blind send ret");
                  ref_interp_local._4_4_ = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x96c,"ref_interp_max_error",(ulong)uVar4,"blind send cell");
                ref_interp_local._4_4_ = uVar4;
              }
            }
          }
        }
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_max_error(REF_INTERP ref_interp,
                                        REF_DBL *max_error) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_CELL from_cell;
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL error;
  REF_INT i, j;
  REF_INT receptor, n_recept, donation, n_donor;
  REF_DBL *recept_xyz, *donor_xyz, *recept_bary, *donor_bary;
  REF_INT *donor_node, *donor_ret, *donor_cell;
  REF_INT *recept_proc, *recept_ret, *recept_node, *recept_cell;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  *max_error = 0.0;

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_node, n_recept, REF_INT);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_proc, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_proc[n_recept] = ref_interp->part[node];
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_node[n_recept] = node;
      recept_ret[n_recept] = ref_mpi_rank(ref_mpi);
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_node, 1, n_recept,
                        (void **)(&donor_node), &n_donor, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, recept_proc, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_free(recept_proc);
  ref_free(recept_ret);
  ref_free(recept_node);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_malloc(donor_xyz, 3 * n_donor, REF_DBL);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < 3; i++) {
      donor_xyz[i + 3 * donation] = 0.0;
      for (j = 0; j < ref_cell_node_per(from_cell); j++) {
        donor_xyz[i + 3 * donation] +=
            donor_bary[j + 4 * donation] * ref_node_xyz(from_node, i, nodes[j]);
      }
    }
  }
  ref_free(donor_cell);
  ref_free(donor_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_xyz, 3, n_donor,
                        (void **)(&recept_xyz), &n_recept, REF_DBL_TYPE),
      "blind send bary");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_node, 1, n_donor,
                        (void **)(&recept_node), &n_recept, REF_INT_TYPE),
      "blind send node");
  ref_free(donor_xyz);
  ref_free(donor_node);
  ref_free(donor_ret);

  for (receptor = 0; receptor < n_recept; receptor++) {
    node = recept_node[receptor];
    error =
        pow(recept_xyz[0 + 3 * receptor] - ref_node_xyz(to_node, 0, node), 2) +
        pow(recept_xyz[1 + 3 * receptor] - ref_node_xyz(to_node, 1, node), 2) +
        pow(recept_xyz[2 + 3 * receptor] - ref_node_xyz(to_node, 2, node), 2);
    *max_error = MAX(*max_error, sqrt(error));
  }
  ref_free(recept_node);
  ref_free(recept_xyz);

  error = *max_error;
  RSS(ref_mpi_max(ref_mpi, &error, max_error, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &max_error, 1, REF_DBL_TYPE), "max");

  return REF_SUCCESS;
}